

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorTest.cpp
# Opt level: O2

void __thiscall
IteratorTest_ConstIterator_Test::~IteratorTest_ConstIterator_Test
          (IteratorTest_ConstIterator_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(IteratorTest, ConstIterator) {
    Deque<int> myDeque;
    std::deque<int> stdDeque;
    for (int i = 0; i < 100; ++i) {
        myDeque.push_back(i);
        stdDeque.push_back(i);
    }
    auto p = std::mismatch(myDeque.cbegin(), myDeque.cend(), stdDeque.cbegin());
    ASSERT_EQ(p.first, myDeque.cend());
}